

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowMovingDevice::IfcFlowMovingDevice(IfcFlowMovingDevice *this)

{
  *(undefined ***)&(this->super_IfcDistributionFlowElement).field_0x168 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x170 = 0;
  *(char **)&this->field_0x178 = "IfcFlowMovingDevice";
  IfcDistributionFlowElement::IfcDistributionFlowElement
            (&this->super_IfcDistributionFlowElement,&PTR_construction_vtable_24__0083c728);
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x83c5d0;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).field_0x168 = 0x83c710;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x83c5f8;
  (this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x83c620;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x83c648;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0x83c670;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x138 = 0x83c698;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x148 = 0x83c6c0;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158
       = 0x83c6e8;
  return;
}

Assistant:

IfcFlowMovingDevice() : Object("IfcFlowMovingDevice") {}